

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uuid.cpp
# Opt level: O2

void __thiscall clickhouse::ColumnUUID::ColumnUUID(ColumnUUID *this)

{
  TypeRef local_20;
  
  Type::CreateUUID();
  Column::Column(&this->super_Column,&local_20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_20.super___shared_ptr<clickhouse::Type,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  (this->super_Column)._vptr_Column = (_func_int **)&PTR__ColumnUUID_001868e0;
  std::make_shared<clickhouse::ColumnVector<unsigned_long>>();
  return;
}

Assistant:

ColumnUUID::ColumnUUID()
    : Column(Type::CreateUUID())
    , data_(std::make_shared<ColumnUInt64>())
{
}